

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

int IoCommandWriteAiger(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Aig_Man_t *pAig;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pAVar3;
  FILE *__s;
  char *pcVar4;
  uint fWriteSymbols;
  char *pcVar5;
  size_t sStack_40;
  undefined8 local_38;
  
  Extra_UtilGetoptReset();
  bVar1 = false;
  local_38 = 0;
  fWriteSymbols = 0;
  while( true ) {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"scuvh"), iVar2 == 0x73) {
      fWriteSymbols = fWriteSymbols ^ 1;
    }
    if (iVar2 == -1) break;
    if (iVar2 == 99) {
      local_38 = local_38 ^ 1;
    }
    else if (iVar2 == 0x75) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    else {
      if (iVar2 != 0x76) goto LAB_0028c5ad;
      local_38 = local_38 ^ 0x100000000;
    }
  }
  pAVar3 = pAbc->pNtkCur;
  if (pAVar3 == (Abc_Ntk_t *)0x0) {
    fwrite("Empty network.\n",0xf,1,(FILE *)pAbc->Out);
    return 0;
  }
  if (globalUtilOptind + 1 == argc) {
    if (pAVar3->ntkType == ABC_NTK_STRASH) {
      pcVar4 = argv[globalUtilOptind];
      if (bVar1) {
        pAig = Abc_NtkToDar(pAVar3,0,1);
        pMan = Saig_ManDupIsoCanonical(pAig,local_38._4_4_);
        pAVar3 = Abc_NtkFromAigPhase(pMan);
        Aig_ManStop(pMan);
        Aig_ManStop(pAig);
        Io_WriteAiger(pAVar3,pcVar4,fWriteSymbols,(int)local_38,1);
        Abc_NtkDelete(pAVar3);
        return 0;
      }
      Io_WriteAiger(pAVar3,pcVar4,fWriteSymbols,(int)local_38,0);
      return 0;
    }
    pcVar4 = "Writing this format is only possible for structurally hashed AIGs.\n";
    sStack_40 = 0x43;
    __s = _stdout;
    goto LAB_0028c685;
  }
LAB_0028c5ad:
  fwrite("usage: write_aiger [-scuvh] <file>\n",0x23,1,(FILE *)pAbc->Err);
  fwrite("\t         writes the network in the AIGER format (http://fmv.jku.at/aiger)\n",0x4b,1,
         (FILE *)pAbc->Err);
  pcVar5 = "yes";
  pcVar4 = "yes";
  if (fWriteSymbols == 0) {
    pcVar4 = "no";
  }
  fprintf((FILE *)pAbc->Err,"\t-s     : toggle saving I/O names [default = %s]\n",pcVar4);
  pcVar4 = "yes";
  if ((int)local_38 == 0) {
    pcVar4 = "no";
  }
  fprintf((FILE *)pAbc->Err,"\t-c     : toggle writing more compactly [default = %s]\n",pcVar4);
  pcVar4 = "yes";
  if (!bVar1) {
    pcVar4 = "no";
  }
  fprintf((FILE *)pAbc->Err,"\t-u     : toggle writing canonical AIG structure [default = %s]\n",
          pcVar4);
  if (local_38._4_4_ == 0) {
    pcVar5 = "no";
  }
  fprintf((FILE *)pAbc->Err,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5
         );
  fwrite("\t-h     : print the help massage\n",0x21,1,(FILE *)pAbc->Err);
  pcVar4 = "\tfile   : the name of the file to write (extension .aig)\n";
  sStack_40 = 0x39;
  __s = (FILE *)pAbc->Err;
LAB_0028c685:
  fwrite(pcVar4,sStack_40,1,__s);
  return 1;
}

Assistant:

int IoCommandWriteAiger( Abc_Frame_t * pAbc, int argc, char **argv )
{
    char * pFileName;
    int fWriteSymbols;
    int fCompact;
    int fUnique;
    int fVerbose;
    int c;

    fWriteSymbols = 0;
    fCompact      = 0;
    fUnique       = 0;
    fVerbose      = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "scuvh" ) ) != EOF )
    {
        switch ( c )
        {
            case 's':
                fWriteSymbols ^= 1;
                break;
            case 'c':
                fCompact ^= 1;
                break;
            case 'u':
                fUnique ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( pAbc->pNtkCur == NULL )
    {
        fprintf( pAbc->Out, "Empty network.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the output file name
    pFileName = argv[globalUtilOptind];
    // call the corresponding file writer
    if ( !Abc_NtkIsStrash(pAbc->pNtkCur) )
    {
        fprintf( stdout, "Writing this format is only possible for structurally hashed AIGs.\n" );
        return 1;
    }
    if ( fUnique )
    {
        extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
        extern Abc_Ntk_t * Abc_NtkFromAigPhase( Aig_Man_t * pMan );
        Aig_Man_t * pAig = Abc_NtkToDar( pAbc->pNtkCur, 0, 1 );
        Aig_Man_t * pCan = Saig_ManDupIsoCanonical( pAig, fVerbose );
        Abc_Ntk_t * pTemp = Abc_NtkFromAigPhase( pCan );
        Aig_ManStop( pCan );
        Aig_ManStop( pAig );
        Io_WriteAiger( pTemp, pFileName, fWriteSymbols, fCompact, fUnique );
        Abc_NtkDelete( pTemp );
    }
    else
        Io_WriteAiger( pAbc->pNtkCur, pFileName, fWriteSymbols, fCompact, fUnique );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: write_aiger [-scuvh] <file>\n" );
    fprintf( pAbc->Err, "\t         writes the network in the AIGER format (http://fmv.jku.at/aiger)\n" );
    fprintf( pAbc->Err, "\t-s     : toggle saving I/O names [default = %s]\n", fWriteSymbols? "yes" : "no" );
    fprintf( pAbc->Err, "\t-c     : toggle writing more compactly [default = %s]\n", fCompact? "yes" : "no" );
    fprintf( pAbc->Err, "\t-u     : toggle writing canonical AIG structure [default = %s]\n", fUnique? "yes" : "no" );
    fprintf( pAbc->Err, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes" : "no" );
    fprintf( pAbc->Err, "\t-h     : print the help massage\n" );
    fprintf( pAbc->Err, "\tfile   : the name of the file to write (extension .aig)\n" );
    return 1;
}